

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O3

void __thiscall Fl_Widget::redraw_label(Fl_Widget *this)

{
  uint uVar1;
  Fl_Window *pFVar2;
  int iVar3;
  int iVar4;
  int H;
  int W;
  int local_28 [2];
  
  pFVar2 = window(this);
  if (pFVar2 == (Fl_Window *)0x0) {
    return;
  }
  if (this->box_ == '\0') {
    iVar3 = this->x_ + -1;
    if (this->x_ < 1) {
      iVar3 = 0;
    }
    iVar4 = this->y_ + -1;
    if (this->y_ < 1) {
      iVar4 = 0;
    }
    pFVar2 = window(this);
    damage((Fl_Widget *)pFVar2,0x80,iVar3,iVar4,this->w_ + 2,this->h_ + 2);
  }
  uVar1 = (this->label_).align_;
  if (((char)((uVar1 & 0x10) >> 4) != '\0' || uVar1 == 0) ||
     (pFVar2 = window(this), pFVar2->i == (Fl_X *)0x0)) {
    damage(this,0x80);
    return;
  }
  local_28[0] = 0;
  local_28[1] = 0;
  Fl_Label::measure(&this->label_,local_28 + 1,local_28);
  local_28[0] = local_28[0] + 5;
  uVar1 = (this->label_).align_;
  local_28[1] = local_28[1] + 5;
  pFVar2 = window(this);
  switch(uVar1 & 0xf) {
  case 1:
    iVar3 = this->y_;
    iVar4 = (this->w_ - local_28[1]) / 2 + this->x_;
    goto LAB_001a465c;
  case 2:
    iVar4 = (this->w_ - local_28[1]) / 2 + this->x_;
    iVar3 = this->h_;
    goto LAB_001a46a5;
  default:
    damage((Fl_Widget *)pFVar2,0x80);
    return;
  case 4:
    iVar4 = this->x_ - local_28[1];
    iVar3 = (this->h_ - local_28[0]) / 2 + this->y_;
    break;
  case 5:
    iVar4 = this->x_;
    iVar3 = this->y_;
    goto LAB_001a466b;
  case 6:
    iVar4 = this->x_;
    iVar3 = this->h_ + this->y_;
    break;
  case 7:
    iVar3 = this->y_;
    iVar4 = this->x_ - local_28[1];
    break;
  case 8:
    iVar4 = this->w_ + this->x_;
    iVar3 = (this->h_ - local_28[0]) / 2 + this->y_;
    break;
  case 9:
    iVar3 = this->y_;
    iVar4 = (this->w_ + this->x_) - local_28[1];
    goto LAB_001a465c;
  case 10:
    iVar3 = this->h_;
    iVar4 = (this->w_ + this->x_) - local_28[1];
LAB_001a46a5:
    iVar3 = iVar3 + this->y_;
    break;
  case 0xb:
    iVar3 = this->y_;
    iVar4 = this->w_ + this->x_;
    break;
  case 0xd:
    iVar4 = this->x_ - local_28[1];
    iVar3 = this->h_ + this->y_;
LAB_001a465c:
    iVar3 = iVar3 - local_28[0];
    break;
  case 0xe:
    iVar4 = this->w_ + this->x_;
    iVar3 = this->h_ + this->y_;
LAB_001a466b:
    iVar3 = iVar3 - local_28[0];
  }
  damage((Fl_Widget *)pFVar2,'\x02',iVar4,iVar3,local_28[1],local_28[0]);
  return;
}

Assistant:

void Fl_Widget::redraw_label() {
  if (window()) {
    if (box() == FL_NO_BOX) {
      // Widgets with the FL_NO_BOX boxtype need a parent to
      // redraw, since it is responsible for redrawing the
      // background...
      int X = x() > 0 ? x() - 1 : 0;
      int Y = y() > 0 ? y() - 1 : 0;
      window()->damage(FL_DAMAGE_ALL, X, Y, w() + 2, h() + 2);
    }

    if (align() && !(align() & FL_ALIGN_INSIDE) && window()->shown()) {
      // If the label is not inside the widget, compute the location of
      // the label and redraw the window within that bounding box...
      int W = 0, H = 0;
      label_.measure(W, H);
      W += 5; // Add a little to the size of the label to cover overflow
      H += 5;

      // FIXME:
      // This assumes that measure() returns the correct outline, which it does
      // not in all possible cases of alignment combinedwith image and symbols.
      switch (align() & 0x0f) {
        case FL_ALIGN_TOP_LEFT:
          window()->damage(FL_DAMAGE_EXPOSE, x(), y()-H, W, H); break;
        case FL_ALIGN_TOP:
          window()->damage(FL_DAMAGE_EXPOSE, x()+(w()-W)/2, y()-H, W, H); break;
        case FL_ALIGN_TOP_RIGHT:
          window()->damage(FL_DAMAGE_EXPOSE, x()+w()-W, y()-H, W, H); break;
        case FL_ALIGN_LEFT_TOP:
          window()->damage(FL_DAMAGE_EXPOSE, x()-W, y(), W, H); break;
        case FL_ALIGN_RIGHT_TOP:
          window()->damage(FL_DAMAGE_EXPOSE, x()+w(), y(), W, H); break;
        case FL_ALIGN_LEFT:
          window()->damage(FL_DAMAGE_EXPOSE, x()-W, y()+(h()-H)/2, W, H); break;
        case FL_ALIGN_RIGHT:
          window()->damage(FL_DAMAGE_EXPOSE, x()+w(), y()+(h()-H)/2, W, H); break;
        case FL_ALIGN_LEFT_BOTTOM:
          window()->damage(FL_DAMAGE_EXPOSE, x()-W, y()+h()-H, W, H); break;
        case FL_ALIGN_RIGHT_BOTTOM:
          window()->damage(FL_DAMAGE_EXPOSE, x()+w(), y()+h()-H, W, H); break;
        case FL_ALIGN_BOTTOM_LEFT:
          window()->damage(FL_DAMAGE_EXPOSE, x(), y()+h(), W, H); break;
        case FL_ALIGN_BOTTOM:
          window()->damage(FL_DAMAGE_EXPOSE, x()+(w()-W)/2, y()+h(), W, H); break;
        case FL_ALIGN_BOTTOM_RIGHT:
          window()->damage(FL_DAMAGE_EXPOSE, x()+w()-W, y()+h(), W, H); break;
        default:
          window()->damage(FL_DAMAGE_ALL); break;
      }
    } else {
      // The label is inside the widget, so just redraw the widget itself...
      damage(FL_DAMAGE_ALL);
    }
  }
}